

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbt_rule.cpp
# Opt level: O1

void __thiscall icu_63::TransliterationRule::~TransliterationRule(TransliterationRule *this)

{
  this->_vptr_TransliterationRule = (_func_int **)&PTR__TransliterationRule_00475c00;
  uprv_free_63(this->segments);
  if (this->anteContext != (StringMatcher *)0x0) {
    (*(this->anteContext->super_UnicodeFunctor).super_UObject._vptr_UObject[1])();
  }
  if (this->key != (StringMatcher *)0x0) {
    (*(this->key->super_UnicodeFunctor).super_UObject._vptr_UObject[1])();
  }
  if (this->postContext != (StringMatcher *)0x0) {
    (*(this->postContext->super_UnicodeFunctor).super_UObject._vptr_UObject[1])();
  }
  if (this->output != (UnicodeFunctor *)0x0) {
    (*(this->output->super_UObject)._vptr_UObject[1])();
  }
  icu_63::UnicodeString::~UnicodeString(&this->pattern);
  return;
}

Assistant:

TransliterationRule::~TransliterationRule() {
    uprv_free(segments);
    delete anteContext;
    delete key;
    delete postContext;
    delete output;
}